

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O3

void __thiscall
sznet::net::EventLoopThreadPool::start(EventLoopThreadPool *this,ThreadInitCallback *cb)

{
  pointer *pppEVar1;
  EventLoop *this_00;
  iterator __position;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  EventLoopThread *this_01;
  uint uVar5;
  ulong uVar6;
  undefined1 local_88 [8];
  vector<char,_std::allocator<char>_> vbuf;
  undefined1 local_60 [32];
  _Any_data *local_40;
  allocator local_31;
  
  local_40 = (_Any_data *)cb;
  if (this->m_started != true) {
    this_00 = this->m_baseLoop;
    bVar3 = EventLoop::isInLoopThread(this_00);
    if (!bVar3) {
      EventLoop::abortNotInLoopThread(this_00);
    }
    this->m_started = true;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_88,
               (this->m_name)._M_string_length + 0x20,(allocator_type *)local_60);
    iVar4 = this->m_numThreads;
    if (0 < iVar4) {
      vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&this->m_threads;
      uVar6 = 0;
      do {
        snprintf((char *)local_88,
                 (long)vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start - (long)local_88,"%s%d",
                 (this->m_name)._M_dataplus._M_p,uVar6);
        this_01 = (EventLoopThread *)operator_new(0x168);
        std::__cxx11::string::string((string *)local_60,(char *)local_88,&local_31);
        EventLoopThread::EventLoopThread(this_01,(ThreadInitCallback *)local_40,(string *)local_60);
        if ((EventLoop *)local_60._0_8_ != (EventLoop *)(local_60 + 0x10)) {
          operator_delete((void *)local_60._0_8_);
        }
        local_60._0_8_ = this_01;
        std::
        vector<std::unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>,std::allocator<std::unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>>>
        ::
        emplace_back<std::unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>>
                  ((vector<std::unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>,std::allocator<std::unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>>>
                    *)vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                   (unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>
                    *)local_60);
        uVar2 = local_60._0_8_;
        if ((EventLoopThread *)local_60._0_8_ != (EventLoopThread *)0x0) {
          EventLoopThread::~EventLoopThread((EventLoopThread *)local_60._0_8_);
          operator_delete((void *)uVar2);
        }
        local_60._0_8_ = EventLoopThread::startLoop(this_01);
        __position._M_current =
             (this->m_loops).
             super__Vector_base<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_loops).
            super__Vector_base<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<sznet::net::EventLoop*,std::allocator<sznet::net::EventLoop*>>::
          _M_realloc_insert<sznet::net::EventLoop*>
                    ((vector<sznet::net::EventLoop*,std::allocator<sznet::net::EventLoop*>> *)
                     &this->m_loops,__position,(EventLoop **)local_60);
        }
        else {
          *__position._M_current = (EventLoop *)local_60._0_8_;
          pppEVar1 = &(this->m_loops).
                      super__Vector_base<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
        iVar4 = this->m_numThreads;
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
      } while ((int)uVar5 < iVar4);
    }
    if ((iVar4 == 0) && (*(long *)(local_40 + 1) != 0)) {
      local_60._0_8_ = this->m_baseLoop;
      (**(code **)((long)local_40 + 0x18))(local_40,(EventLoop **)local_60);
    }
    if (local_88 != (undefined1  [8])0x0) {
      operator_delete((void *)local_88);
    }
    return;
  }
  __assert_fail("!m_started",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoopThreadPool.cpp"
                ,0x1d,"void sznet::net::EventLoopThreadPool::start(const ThreadInitCallback &)");
}

Assistant:

void EventLoopThreadPool::start(const ThreadInitCallback& cb)
{
	assert(!m_started);
	m_baseLoop->assertInLoopThread();
	m_started = true;

	std::vector<char> vbuf(m_name.size() + 32);
	for (int i = 0; i < m_numThreads; ++i)
	{
		snprintf(vbuf.data(), vbuf.size(), "%s%d", m_name.c_str(), i);
		EventLoopThread* t = new EventLoopThread(cb, vbuf.data());
		m_threads.push_back(std::unique_ptr<EventLoopThread>(t));
		// 阻塞
		// 启动EventLoopThread线程，在进入事件循环之前，会调用cb
		m_loops.push_back(t->startLoop());
	}
	// 只有一个EventLoop，在这个EventLoop进入事件循环之前，调用cb
	if (m_numThreads == 0 && cb)
	{
		cb(m_baseLoop);
	}
}